

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  bool bVar1;
  long in_RSI;
  Mat *in_RDI;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  Option *in_stack_000007e8;
  float in_stack_000007f4;
  Mat *in_stack_000007f8;
  Mat *in_stack_00000800;
  Allocator *in_stack_fffffffffffffec8;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 uVar2;
  int local_70;
  Mat local_58;
  int local_4;
  
  if ((((*(byte *)(in_RSI + 0x1a) & 1) != 0) && (in_RDI[5].elemsize == 4)) && (in_RDI[3].c != 0)) {
    this_00 = &local_58;
    Mat::Mat(in_RDI,in_stack_fffffffffffffedc,(size_t)this_00,in_stack_fffffffffffffec8);
    bVar1 = Mat::empty(this_00);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    if (bVar1) {
      local_4 = -100;
      bVar1 = true;
    }
    else {
      for (local_70 = 0; local_70 < in_RDI[3].h; local_70 = local_70 + 1) {
        Mat::range((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),(int)((ulong)this_00 >> 0x20),
                   (int)this_00);
        Mat::range((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),(int)((ulong)this_00 >> 0x20),
                   (int)this_00);
        Mat::operator[](in_RDI + 7,(long)local_70);
        quantize_float32_to_int8
                  (in_stack_00000800,in_stack_000007f8,in_stack_000007f4,in_stack_000007e8);
        Mat::~Mat((Mat *)0x18e2d2);
        Mat::~Mat((Mat *)0x18e2dc);
      }
      Mat::operator=((Mat *)CONCAT44(uVar2,in_stack_fffffffffffffed8),this_00);
      bVar1 = false;
    }
    Mat::~Mat((Mat *)0x18e365);
    if (bVar1) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            quantize_float32_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales[g], opt_q);
        }

        weight_data = int8_weight_data;
    }

    return 0;
}